

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

void vectorize_use_func(Item *qname,Item *qpar1,Item *qexpr,Item *qpar2,int blocktype)

{
  int iVar1;
  Item *in_RCX;
  Item *in_RDX;
  Item *in_RSI;
  long in_RDI;
  int in_R8D;
  Item *q;
  Item *in_stack_ffffffffffffffc8;
  Item *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  if ((*(ulong *)(*(long *)(in_RDI + 8) + 8) & 0x8000) == 0) {
    if (in_RDX == (Item *)0x0) {
      insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    }
    else {
      insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    }
  }
  else {
    iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 8) + 0x48),"nrn_pointing");
    if (iVar1 == 0) {
      insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    }
    else {
      iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 8) + 0x48),"state_discontinuity");
      if (iVar1 == 0) {
        fprintf(_stderr,"Notice: Use of state_discontinuity is not thread safe");
        vectorize = 0;
        if (in_R8D == 0x16a) {
          fprintf(_stderr,
                  "Notice: Use of state_discontinuity in a NET_RECEIVE block is unnecessary and prevents use of this mechanism in a multithreaded simulation.\n"
                 );
        }
        if (state_discon_list_ == (List *)0x0) {
          state_discon_list_ = newlist();
        }
        lappenditem(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
      }
      else {
        iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 8) + 0x48),"net_send");
        if (iVar1 == 0) {
          net_send_seen_ = 1;
          if (artificial_cell != 0) {
            replacstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
          }
          insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
          if (in_R8D == 0x16a) {
            acc_net_add(in_RSI,in_RDX,in_RCX,(Item *)CONCAT44(0x16a,in_stack_ffffffffffffffd8),
                        (char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
            insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
          }
          else if (in_R8D == 0x109) {
            net_send_buffer_in_initial = 1;
            acc_net_add(in_RSI,in_RDX,in_RCX,(Item *)CONCAT44(0x109,in_stack_ffffffffffffffd8),
                        (char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
            insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
          }
          else {
            diag((char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
          }
        }
        else {
          iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 8) + 0x48),"net_event");
          if (iVar1 == 0) {
            net_event_seen_ = 1;
            if (in_R8D == 0x16a) {
              acc_net_add(in_RSI,in_RDX,in_RCX,(Item *)CONCAT44(0x16a,in_stack_ffffffffffffffd8),
                          (char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
              insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
            }
            else {
              diag((char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
            }
          }
          else {
            iVar1 = strcmp(*(char **)(*(long *)(in_RDI + 8) + 0x48),"net_move");
            if (iVar1 == 0) {
              if (artificial_cell != 0) {
                replacstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
              }
              if (in_R8D == 0x16a) {
                acc_net_add(in_RSI,in_RDX,in_RCX,(Item *)CONCAT44(0x16a,in_stack_ffffffffffffffd8),
                            (char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
                insertstr(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
              }
              else {
                diag((char *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void vectorize_use_func(qname, qpar1, qexpr, qpar2, blocktype)
	Item* qname, *qpar1, *qexpr, *qpar2;
	int blocktype;
{
	Item* q;
	if (SYM(qname)->subtype &  EXTDEF) {
		if (strcmp(SYM(qname)->name, "nrn_pointing") == 0) {
			Insertstr(qpar1->next, "&");
		}else if (strcmp(SYM(qname)->name, "state_discontinuity") == 0) {
#if CVODE
fprintf(stderr, "Notice: Use of state_discontinuity is not thread safe");
			vectorize = 0;
			if (blocktype == NETRECEIVE) {
Fprintf(stderr, "Notice: Use of state_discontinuity in a NET_RECEIVE block is unnecessary and prevents use of this mechanism in a multithreaded simulation.\n");
			}
			if (!state_discon_list_) {
				state_discon_list_ = newlist();
			}
			lappenditem(state_discon_list_, qpar1->next);
#endif
			Insertstr(qpar1->next, "-1, &");
		}else if (strcmp(SYM(qname)->name, "net_send") == 0) {
			net_send_seen_ = 1;
			if (artificial_cell) {
				replacstr(qname, "artcell_net_send");
			}
			Insertstr(qexpr, "t + ");
			if (blocktype == NETRECEIVE) {
acc_net_add(qname, qpar1, qexpr, qpar2, "0, _tqitem, _weight_index, _ppvar[1*_STRIDE],", "");
				Insertstr(qpar1->next, "_tqitem, _weight_index, _pnt,");
			}else if (blocktype == INITIAL1){
			  net_send_buffer_in_initial = 1;
acc_net_add(qname, qpar1, qexpr, qpar2, "0, _tqitem, 0,  _ppvar[1*_STRIDE],", "");
				Insertstr(qpar1->next, "_tqitem, -1, (Point_process*) _nt->_vdata[_ppvar[1*_STRIDE]],");
			}else{
diag("net_send allowed only in INITIAL and NET_RECEIVE blocks", (char*)0);
			}
		}else if (strcmp(SYM(qname)->name, "net_event") == 0) {
			net_event_seen_ = 1;
			if (blocktype == NETRECEIVE) {
acc_net_add(qname, qpar1, qexpr, qpar2, "1, -1, -1,  _ppvar[1*_STRIDE],", ", 0.");
				Insertstr(qpar1->next, "_pnt,");
			}else{
diag("net_event", " only allowed in NET_RECEIVE block");
			}
		}else if (strcmp(SYM(qname)->name, "net_move") == 0) {
			if (artificial_cell) {
				replacstr(qname, "artcell_net_move");
			}
			if (blocktype == NETRECEIVE) {
acc_net_add(qname, qpar1, qexpr, qpar2, "2, _tqitem, -1, _ppvar[1*_STRIDE],", ", 0.");
				Insertstr(qpar1->next, "_tqitem, _pnt,");
			}else{
diag("net_move", " only allowed in NET_RECEIVE block");
			}
		}
		return;
	}
#if 1
	if (qexpr) {
		q = insertstr(qpar1->next, "_threadargscomma_");
	}else{
		q = insertstr(qpar1->next, "_threadargs_");
	}
#else
	q = insertstr(qpar1->next, "");
	if (qexpr) {
		vectorize_substitute(q, "_threadargs_,");
	}else{
		vectorize_substitute(q, "_threadargs_");
	}
#endif
}